

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcaf_fold_regex(int n,mpc_val_t **xs)

{
  char *__s;
  long lVar1;
  mpc_val_t *__ptr;
  mpc_parser_t *pmVar2;
  long in_RSI;
  int mode;
  mpc_parser_t *p;
  mpca_grammar_st_t *st;
  char *m;
  char *y;
  int in_stack_0000007c;
  char *in_stack_00000080;
  mpc_apply_t in_stack_ffffffffffffffb8;
  mpc_parser_t *in_stack_ffffffffffffffc0;
  
  __s = *(char **)(in_RSI + 8);
  lVar1 = *(long *)(in_RSI + 0x10);
  strchr(__s,0x6d);
  strchr(__s,0x73);
  __ptr = mpcf_unescape_regex(in_stack_ffffffffffffffc0);
  if ((*(uint *)(lVar1 + 0x18) & 2) == 0) {
    mpc_re_mode(in_stack_00000080,in_stack_0000007c);
    pmVar2 = mpc_tok(in_stack_ffffffffffffffc0);
  }
  else {
    pmVar2 = mpc_re_mode(in_stack_00000080,in_stack_0000007c);
  }
  free(__ptr);
  free(__s);
  mpc_apply(pmVar2,in_stack_ffffffffffffffb8);
  mpca_tag(pmVar2,(char *)in_stack_ffffffffffffffb8);
  pmVar2 = mpca_state((mpc_parser_t *)0x29d683);
  return pmVar2;
}

Assistant:

static mpc_val_t *mpcaf_fold_regex(int n, mpc_val_t **xs) {
  char *y = xs[0];
  char *m = xs[1];
  mpca_grammar_st_t *st = xs[2];
  mpc_parser_t *p;
  int mode = MPC_RE_DEFAULT;

  (void)n;
  if (strchr(m, 'm')) { mode |= MPC_RE_MULTILINE; }
  if (strchr(m, 's')) { mode |= MPC_RE_DOTALL; }
  y = mpcf_unescape_regex(y);
  p = (st->flags & MPCA_LANG_WHITESPACE_SENSITIVE) ? mpc_re_mode(y, mode) : mpc_tok(mpc_re_mode(y, mode));
  free(y);
  free(m);

  return mpca_state(mpca_tag(mpc_apply(p, mpcf_str_ast), "regex"));
}